

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall Liby::Socket::Socket(Socket *this,fdPtr *fp,Endpoint *ep,bool isUdp)

{
  this->isUdp_ = isUdp;
  this->fd_ = ((fp->super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              fd_;
  std::__shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>,
             &fp->super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>);
  this->ep_ = *ep;
  return;
}

Assistant:

Socket::Socket(const fdPtr &fp, const Endpoint &ep, bool isUdp)
    : isUdp_(isUdp), fd_(fp->fd()), fp_(fp), ep_(ep) {}